

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::populate_grid(Plotter *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer *ppPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer puVar7;
  pointer puVar8;
  iterator __position;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  pointer pPVar20;
  unsigned_long uVar21;
  int iVar22;
  long lVar23;
  pointer paVar24;
  pointer pDVar25;
  long *in_FS_OFFSET;
  double dVar26;
  double dVar27;
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  size_t hi;
  anon_class_24_3_02951b27 bfs;
  size_t lo;
  size_t local_a0;
  ulong local_98;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_90;
  anon_class_24_3_02951b27 local_88;
  PointMarker local_70;
  size_t local_38;
  
  this_00 = &this->grid;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)(this->view).shigh * (long)(this->view).swid);
  puVar7 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar8) {
    memset(puVar7,0xff,((long)puVar8 + (-8 - (long)puVar7) & 0xfffffffffffffff8U) + 8);
  }
  if ((char)in_FS_OFFSET[-0x8f] == '\0') {
    populate_grid();
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
             (*in_FS_OFFSET + -0x490),(long)(this->view).shigh * (long)(this->view).swid);
  local_88.lo = &local_38;
  local_38 = 0;
  local_88.hi = &local_a0;
  local_a0 = 0;
  pPVar20 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar20) {
    lVar15 = 0x30;
    uVar16 = 0;
    do {
      if ((*(char *)((long)&pPVar20->x + lVar15) == '\0') &&
         ((*(long *)((long)pPVar20 + lVar15 + -0x10) != -1 ||
          (*(long *)((long)pPVar20 + lVar15 + -8) != -1)))) {
        dVar27 = (this->view).ymax;
        dVar4 = (this->view).xmin;
        uVar2 = (this->view).swid;
        uVar5 = (this->view).shigh;
        auVar33._0_8_ = (double)(int)uVar5 * (dVar27 - *(double *)((long)pPVar20 + lVar15 + -0x28));
        auVar33._8_8_ = (double)(int)uVar2 * (*(double *)((long)pPVar20 + lVar15 + -0x30) - dVar4);
        dVar4 = (this->view).xmax - dVar4;
        auVar34._8_4_ = SUB84(dVar4,0);
        auVar34._0_8_ = dVar27 - (this->view).ymin;
        auVar34._12_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar34 = divpd(auVar33,auVar34);
        iVar31 = (int)((float)auVar34._0_8_ + 0.5);
        iVar32 = (int)((float)auVar34._8_8_ + 0.5);
        auVar13._4_4_ = -(uint)(-1 < iVar31);
        auVar13._0_4_ = -(uint)(-1 < iVar32);
        auVar13._8_4_ = -(uint)(iVar32 < (int)uVar2);
        auVar13._12_4_ = -(uint)(iVar31 < (int)uVar5);
        iVar17 = movmskps((int)pPVar20,auVar13);
        if (iVar17 == 0xf) {
          uVar18 = iVar32 + uVar2 * iVar31;
          puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar7[uVar18] == 0xffffffffffffffff) {
            puVar7[(int)uVar18] = uVar16;
            lVar23 = in_FS_OFFSET[-0x92];
            lVar19 = local_a0 * 0x10;
            *(ulong *)(lVar23 + lVar19) = CONCAT44(iVar32,iVar31);
            *(int *)(lVar23 + 8 + lVar19) = (int)uVar16;
            *(undefined4 *)(lVar23 + 0xc + lVar19) = 0;
            local_a0 = local_a0 + 1;
          }
        }
      }
      uVar16 = uVar16 + 1;
      pPVar20 = (this->pt_markers).
                super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x38;
    } while (uVar16 < (ulong)(((long)(this->pt_markers).
                                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar20 >> 3
                              ) * 0x6db6db6db6db6db7));
  }
  local_88.this = this;
  populate_grid::anon_class_24_3_02951b27::operator()(&local_88);
  pPVar20 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar20) {
    lVar15 = 0x30;
    uVar16 = 0;
    do {
      if (((*(char *)((long)&pPVar20->x + lVar15) == '\0') &&
          (*(long *)((long)pPVar20 + lVar15 + -0x10) == -1)) &&
         (*(long *)((long)pPVar20 + lVar15 + -8) == -1)) {
        dVar27 = (this->view).ymax;
        dVar4 = (this->view).xmin;
        uVar3 = (this->view).swid;
        uVar6 = (this->view).shigh;
        auVar35._0_8_ = (double)(int)uVar6 * (dVar27 - *(double *)((long)pPVar20 + lVar15 + -0x28));
        auVar35._8_8_ = (double)(int)uVar3 * (*(double *)((long)pPVar20 + lVar15 + -0x30) - dVar4);
        dVar4 = (this->view).xmax - dVar4;
        auVar10._8_4_ = SUB84(dVar4,0);
        auVar10._0_8_ = dVar27 - (this->view).ymin;
        auVar10._12_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar34 = divpd(auVar35,auVar10);
        iVar31 = (int)((float)auVar34._0_8_ + 0.5);
        iVar32 = (int)((float)auVar34._8_8_ + 0.5);
        auVar14._4_4_ = -(uint)(-1 < iVar31);
        auVar14._0_4_ = -(uint)(-1 < iVar32);
        auVar14._8_4_ = -(uint)(iVar32 < (int)uVar3);
        auVar14._12_4_ = -(uint)(iVar31 < (int)uVar6);
        iVar17 = movmskps((int)pPVar20,auVar14);
        if (iVar17 == 0xf) {
          uVar18 = iVar32 + uVar3 * iVar31;
          puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar7[uVar18] == 0xffffffffffffffff) {
            puVar7[(int)uVar18] = uVar16;
            lVar23 = in_FS_OFFSET[-0x92];
            lVar19 = local_a0 * 0x10;
            *(ulong *)(lVar23 + lVar19) = CONCAT44(iVar32,iVar31);
            *(int *)(lVar23 + 8 + lVar19) = (int)uVar16;
            *(undefined4 *)(lVar23 + 0xc + lVar19) = 0;
            local_a0 = local_a0 + 1;
          }
        }
      }
      uVar16 = uVar16 + 1;
      pPVar20 = (this->pt_markers).
                super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x38;
    } while (uVar16 < (ulong)(((long)(this->pt_markers).
                                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar20 >> 3
                              ) * 0x6db6db6db6db6db7));
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&local_88);
  pDVar25 = (this->draw_buf).
            super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->draw_buf).
      super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar25) {
    local_90 = &this->pt_markers;
    uVar16 = 0;
    do {
      local_98 = uVar16;
      if (pDVar25[uVar16].type == POLYLINE) {
        pDVar25 = pDVar25 + uVar16;
        paVar24 = (pDVar25->points).
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0x10 < (ulong)((long)(pDVar25->points).
                                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar24)) {
          uVar16 = 1;
          do {
            __position._M_current =
                 (this->pt_markers).
                 super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            pPVar20 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_70.x = paVar24[uVar16 - 1]._M_elems[0];
            local_70.y = paVar24[uVar16 - 1]._M_elems[1];
            local_70.label = LABEL_NONE;
            local_70.rel_func = pDVar25->rel_func;
            local_70.passive = true;
            local_70.drag_var_x._0_4_ = 0xffffffff;
            local_70.drag_var_x._4_4_ = 0xffffffff;
            local_70.drag_var_y._0_4_ = 0xffffffff;
            local_70.drag_var_y._4_4_ = 0xffffffff;
            if (__position._M_current ==
                (this->pt_markers).
                super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
              _M_realloc_insert<nivalis::PointMarker>(local_90,__position,&local_70);
            }
            else {
              *(ulong *)&(__position._M_current)->passive = CONCAT71(local_70._49_7_,1);
              (__position._M_current)->drag_var_x = 0xffffffffffffffff;
              (__position._M_current)->drag_var_y = 0xffffffffffffffff;
              *(ulong *)&(__position._M_current)->label = (ulong)(uint)local_70._20_4_ << 0x20;
              (__position._M_current)->rel_func = local_70.rel_func;
              (__position._M_current)->x = local_70.x;
              (__position._M_current)->y = local_70.y;
              ppPVar1 = &(this->pt_markers).
                         super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            paVar24 = paVar24 + uVar16;
            iVar17 = (this->view).swid;
            dVar26 = (double)iVar17;
            dVar4 = (this->view).xmin;
            dVar27 = (this->view).xmax - dVar4;
            auVar28._0_8_ = dVar26 * (paVar24->_M_elems[0] - dVar4);
            auVar28._8_8_ = dVar26 * (paVar24[-1]._M_elems[0] - dVar4);
            auVar12._8_4_ = SUB84(dVar27,0);
            auVar12._0_8_ = dVar27;
            auVar12._12_4_ = (int)((ulong)dVar27 >> 0x20);
            auVar34 = divpd(auVar28,auVar12);
            iVar31 = (int)((float)auVar34._8_8_ + 0.5);
            if (((-1 < iVar31) && (iVar31 < iVar17)) &&
               ((int)((float)auVar34._0_8_ + 0.5) - iVar31 < 2)) {
              iVar17 = (this->view).shigh;
              dVar27 = (double)iVar17;
              dVar4 = (this->view).ymax;
              auVar29._0_8_ = dVar27 * (dVar4 - paVar24[-1]._M_elems[1]);
              auVar29._8_8_ = dVar27 * (dVar4 - paVar24->_M_elems[1]);
              dVar4 = dVar4 - (this->view).ymin;
              auVar11._8_4_ = SUB84(dVar4,0);
              auVar11._0_8_ = dVar4;
              auVar11._12_4_ = (int)((ulong)dVar4 >> 0x20);
              auVar34 = divpd(auVar29,auVar11);
              iVar32 = (int)((float)auVar34._0_8_ + 0.5);
              iVar30 = (int)((float)auVar34._8_8_ + 0.5);
              bVar9 = iVar32 <= iVar30;
              iVar17 = iVar17 + -1;
              if (iVar32 < 1) {
                iVar32 = 0;
              }
              if (iVar17 < iVar32) {
                iVar32 = iVar17;
              }
              if (iVar30 < 1) {
                iVar30 = 0;
              }
              if (iVar30 <= iVar17) {
                iVar17 = iVar30;
              }
              if (iVar32 != iVar17 + (uint)bVar9 * 2 + -1) {
                uVar21 = ((long)__position._M_current - (long)pPVar20 >> 3) * 0x6db6db6db6db6db7;
                iVar17 = (uint)bVar9 * 2 + -1;
                do {
                  iVar22 = (this->view).swid * iVar32 + iVar31;
                  puVar7 = (this->grid).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if (puVar7[iVar22] == 0xffffffffffffffff) {
                    puVar7[iVar22] = uVar21;
                    lVar15 = in_FS_OFFSET[-0x92];
                    lVar23 = local_a0 * 0x10;
                    *(int *)(lVar15 + lVar23) = iVar32;
                    *(int *)(lVar15 + 4 + lVar23) = iVar31;
                    *(int *)(lVar15 + 8 + lVar23) = (int)uVar21;
                    *(undefined4 *)(lVar15 + 0xc + lVar23) = 0;
                    local_a0 = local_a0 + 1;
                  }
                  iVar32 = iVar32 + iVar17;
                  iVar22 = (this->view).shigh + -1;
                  if (iVar30 <= iVar22) {
                    iVar22 = iVar30;
                  }
                } while (iVar32 - iVar17 != iVar22);
              }
            }
            uVar16 = uVar16 + 1;
            paVar24 = (pDVar25->points).
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)((long)(pDVar25->points).
                                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar24
                                   >> 4));
        }
      }
      uVar16 = local_98 + 1;
      pDVar25 = (this->draw_buf).
                super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(this->draw_buf).
                                    super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25 >> 7)
            );
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&local_88);
  return;
}

Assistant:

void Plotter::populate_grid() {
    const int r = marker_clickable_radius;
    grid.resize(view.swid * view.shigh);
    std::fill(grid.begin(), grid.end(), -1);

    thread_local std::vector<
            std::array<int, 4> // y x id dist
            > que;
    que.resize(view.swid * view.shigh);

    size_t lo = 0, hi = 0;
    auto bfs = [&]{
        // BFS to fill grid
        while(lo < hi) {
            const auto& v = que[lo++];
            int sy = v[0], sx = v[1], id = v[2], d = v[3];
            if (d >= marker_clickable_radius) continue;
            if (sy > 0 && grid[(sy - 1) * view.swid + sx] == -1) {
                que[hi++] = { sy - 1, sx, id, d + 1};
                grid[(sy - 1) * view.swid + sx] = id;
            }
            if (sx > 0 && grid[sy * view.swid + sx - 1] == -1) {
                que[hi++] = { sy, sx - 1, id, d + 1};
                grid[sy * view.swid + sx - 1] = id;
            }
            if (sx < view.swid - 1 && grid[sy * view.swid + sx + 1] == -1) {
                que[hi++] = { sy, sx + 1, id, d + 1};
                grid[sy * view.swid + sx + 1] = id;
            }
            if (sy < view.shigh - 1 && grid[(sy + 1) * view.swid + sx] == -1) {
                que[hi++] = { sy + 1, sx, id, d + 1};
                grid[(sy + 1) * view.swid + sx] = id;
            }
        }
    };

    // Pass 1: BFS from draggable markers
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || (ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 2: BFS from non-draggable, active (i.e. text-on-hover) markers
    // only goes through grid cells not already visited
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || !(ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 3: Construct and push passive markers (for clicking on functions)
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        const auto & obj = draw_buf[i];
        if (obj.type == DrawBufferObject::POLYLINE) {
            const auto& points = obj.points;
            for (size_t j = 1; j < points.size(); ++j) {
                const std::array<double, 2>& p = points[j - 1];
                const std::array<double, 2>& q = points[j];
                size_t id = pt_markers.size();
                {
                    PointMarker ptm;
                    ptm.x = p[0]; ptm.y = p[1];
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.rel_func = obj.rel_func;
                    ptm.passive = true;
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    pt_markers.push_back(std::move(ptm));
                }
                int psx = (int)(0.5 + _X_TO_SX(p[0]));
                int qsx = (int)(0.5 + _X_TO_SX(q[0]));
                if (psx < 0 || psx >= view.swid || qsx - psx > 1) continue;

                int psy = (int)(0.5 + _Y_TO_SY(p[1]));
                int qsy = (int)(0.5 + _Y_TO_SY(q[1]));
                int dir = qsy >= psy ? 1 : -1;
                for (int r = std::min(std::max(psy, 0), view.shigh - 1);
                        r != std::min(std::max(qsy, 0), view.shigh - 1) + dir; r += dir) {
                    if (~grid[r * view.swid + psx]) continue;
                    grid[r * view.swid + psx] = id;
                    que[hi++] = { r, psx, (int)id, 0 };
                }
            }
        }
    }
    bfs();
}